

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ConstraintItemSyntax> *args_1,
          Token *args_2)

{
  size_t sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ConstraintBlockSyntax *pCVar15;
  long lVar16;
  
  pCVar15 = (ConstraintBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintBlockSyntax *)this->endPtr < pCVar15 + 1) {
    pCVar15 = (ConstraintBlockSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pCVar15 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar3 = args->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar4 = args_2->info;
  (pCVar15->super_ConstraintItemSyntax).super_SyntaxNode.kind = ConstraintBlock;
  (pCVar15->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar15->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar15->openBrace).kind = TVar6;
  (pCVar15->openBrace).field_0x2 = uVar7;
  (pCVar15->openBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar15->openBrace).rawLen = uVar9;
  (pCVar15->openBrace).info = pIVar3;
  uVar10 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar15->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar10;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar15->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pCVar15->items).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>._M_ptr
       = (args_1->super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (pCVar15->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623c88;
  (pCVar15->closeBrace).kind = TVar11;
  (pCVar15->closeBrace).field_0x2 = uVar12;
  (pCVar15->closeBrace).numFlags = (NumericTokenFlags)NVar13.raw;
  (pCVar15->closeBrace).rawLen = uVar14;
  (pCVar15->closeBrace).info = pIVar4;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar15;
  sVar1 = (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>
          ._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar2 = (pCVar15->items).
              super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(ConstraintBlockSyntax **)(*(long *)((long)ppCVar2 + lVar16) + 8) = pCVar15;
      lVar16 = lVar16 + 8;
    } while (sVar1 << 3 != lVar16);
  }
  return pCVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }